

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O2

void __thiscall reader_url_suite::test_path_abempty_two::test_method(test_path_abempty_two *this)

{
  bool bVar1;
  uint local_408;
  value local_404;
  view_type local_400;
  undefined8 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  url reader;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [30];
  
  local_400.ptr_ = input;
  builtin_strncpy(input + 0x10,".com/path/two",0xe);
  builtin_strncpy(input,"scheme://example",0x10);
  local_400.len_ = strlen(local_400.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_400);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x8a);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_80 = "";
  local_404 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_408 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_400,&local_88,0x8a,2,2,&local_404,"reader.subcode()",&local_408,
             "url::token::subcode::scheme");
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x8b);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_b0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[7]>
            (&local_400,&local_b8,0x8b,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"scheme","\"scheme\"");
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x8c);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_388 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_404 = CONCAT31(local_404._1_3_,bVar1);
  local_408 = CONCAT31(local_408._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_400,&local_390,0x8c,2,2,&local_404,"reader.next()",&local_408,"true");
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x8d);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_100 = "";
  local_404 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_408 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_400,&local_108,0x8d,2,2,&local_404,"reader.subcode()",&local_408,
             "url::token::subcode::authority_host_name");
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x8e);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_130 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[12]>
            (&local_400,&local_138,0x8e,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"example.com","\"example.com\"");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x8f);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_398 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_404 = CONCAT31(local_404._1_3_,bVar1);
  local_408 = CONCAT31(local_408._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_400,&local_3a0,0x8f,2,2,&local_404,"reader.next()",&local_408,"true");
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x90);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_3a8 = "";
  local_404 = trial::url::token::category
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_408 = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::category::value,trial::url::token::category::value>
            (&local_400,&local_3b0,0x90,2,2,&local_404,"reader.category()",&local_408,
             "url::token::category::path");
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x91);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1a0 = "";
  local_404 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_408 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_400,&local_1a8,0x91,2,2,&local_404,"reader.code()",&local_408,
             "url::token::code::path_segment");
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x92);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_404 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_408 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_400,&local_1d8,0x92,2,2,&local_404,"reader.subcode()",&local_408,
             "url::token::subcode::path_segment");
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x93);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_200 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
            (&local_400,&local_208,0x93,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"path","\"path\"");
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x94);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_3b8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_404 = CONCAT31(local_404._1_3_,bVar1);
  local_408 = CONCAT31(local_408._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_400,&local_3c0,0x94,2,2,&local_404,"reader.next()",&local_408,"true");
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x95);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_3c8 = "";
  local_404 = trial::url::token::category
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_408 = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::category::value,trial::url::token::category::value>
            (&local_400,&local_3d0,0x95,2,2,&local_404,"reader.category()",&local_408,
             "url::token::category::path");
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x96);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_270 = "";
  local_404 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_408 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_400,&local_278,0x96,2,2,&local_404,"reader.code()",&local_408,
             "url::token::code::path_segment");
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_288,0x97);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a0 = "";
  local_404 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_408 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_400,&local_2a8,0x97,2,2,&local_404,"reader.subcode()",&local_408,
             "url::token::subcode::path_segment");
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x98);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2d0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[4]>
            (&local_400,&local_2d8,0x98,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"two","\"two\"");
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,0x99);
  local_400.len_ = local_400.len_ & 0xffffffffffffff00;
  local_400.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_3f0 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_3d8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_404 = CONCAT31(local_404._1_3_,bVar1);
  local_408 = local_408 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_400,&local_3e0,0x99,2,2,&local_404,"reader.next()",&local_408,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_abempty_two)
{
    const char input[] = "scheme://example.com/path/two";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "two");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}